

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall cmDepends::~cmDepends(cmDepends *this)

{
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_007d6ef8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->IncludePath);
  std::__cxx11::string::~string((string *)&this->TargetDirectory);
  std::__cxx11::string::~string((string *)&this->Language);
  return;
}

Assistant:

cmDepends::~cmDepends() = default;